

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

ptls_t * ptls_new(ptls_context_t *ctx,int is_server)

{
  byte bVar1;
  st_ptls_update_open_count_t *psVar2;
  ptls_t *ppVar3;
  byte bVar4;
  
  if (ctx->get_time != (ptls_get_time_t *)0x0) {
    ppVar3 = (ptls_t *)malloc(0x1e8);
    if (ppVar3 == (ptls_t *)0x0) {
      ppVar3 = (ptls_t *)0x0;
    }
    else {
      psVar2 = ctx->update_open_count;
      if (psVar2 != (st_ptls_update_open_count_t *)0x0) {
        (*psVar2->cb)(psVar2,1);
      }
      memset(&ppVar3->state,0,0x1e0);
      ppVar3->ctx = ctx;
      bVar1 = ppVar3->field_0x148;
      bVar4 = (byte)is_server & 1;
      ppVar3->field_0x148 = bVar1 & 0xfe | bVar4;
      ppVar3->field_0x148 = bVar1 & 0xfa | bVar4 | ctx->field_0x60 & 4;
      if (is_server == 0) {
        ppVar3->state = PTLS_STATE_CLIENT_HANDSHAKE_START;
        (*ctx->random_bytes)(ppVar3->client_random,0x20);
        (*ppVar3->ctx->random_bytes)(&ppVar3->field_16,0x20);
      }
      else {
        ppVar3->state = PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO;
        (ppVar3->field_16).server.early_data_skipped_bytes = 0xffffffff;
      }
    }
    return ppVar3;
  }
  __assert_fail("ctx->get_time != NULL && \"please set ctx->get_time to `&ptls_get_time`; see #92\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/windrunner414[P]quicly/deps/picotls/lib/picotls.c"
                ,0xd71,"ptls_t *ptls_new(ptls_context_t *, int)");
}

Assistant:

ptls_t *ptls_new(ptls_context_t *ctx, int is_server)
{
    ptls_t *tls;

    assert(ctx->get_time != NULL && "please set ctx->get_time to `&ptls_get_time`; see #92");

    if ((tls = malloc(sizeof(*tls))) == NULL)
        return NULL;

    update_open_count(ctx, 1);
    *tls = (ptls_t){ctx};
    tls->is_server = is_server;
    tls->send_change_cipher_spec = ctx->send_change_cipher_spec;
    if (!is_server) {
        tls->state = PTLS_STATE_CLIENT_HANDSHAKE_START;
        tls->ctx->random_bytes(tls->client_random, sizeof(tls->client_random));
        tls->ctx->random_bytes(tls->client.legacy_session_id, sizeof(tls->client.legacy_session_id));
    } else {
        tls->state = PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO;
        tls->server.early_data_skipped_bytes = UINT32_MAX;
    }

    return tls;
}